

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ann.cpp
# Opt level: O3

void __thiscall ANN::print(ANN *this,uint index)

{
  pointer pcVar1;
  double dVar2;
  uint uVar3;
  Perceptron *pPVar4;
  string *psVar5;
  ostream *poVar6;
  uint index_00;
  Perceptron perceptron_1;
  Perceptron perceptron;
  char local_d9;
  undefined1 local_d8 [48];
  _Alloc_hider local_a8;
  char local_98 [24];
  Perceptron local_80;
  
  Perceptron::Perceptron(&local_80);
  index_00 = 0;
  while( true ) {
    uVar3 = Layer::get_nb_perceptrons
                      ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                       super__Vector_impl_data._M_start + index);
    if (uVar3 <= index_00) break;
    pPVar4 = Layer::get_perceptron
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start + index,index_00);
    local_d8._0_8_ = pPVar4->m_in;
    local_d8._8_8_ = pPVar4->m_out;
    std::function<double_(double)>::function
              ((function<double_(double)> *)(local_d8 + 0x10),&pPVar4->m_activation);
    local_a8._M_p = local_98;
    pcVar1 = (pPVar4->m_label)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_a8,pcVar1,pcVar1 + (pPVar4->m_label)._M_string_length);
    psVar5 = Layer::label_abi_cxx11_
                       ((this->m_layers).super__Vector_base<Layer,_std::allocator<Layer>_>._M_impl.
                        super__Vector_impl_data._M_start + index,index_00);
    poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(psVar5->_M_dataplus)._M_p,psVar5->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,": ",2);
    dVar2 = Perceptron::get_output((Perceptron *)local_d8);
    poVar6 = std::ostream::_M_insert<double>(dVar2);
    local_d9 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar6,&local_d9,1);
    Perceptron::~Perceptron((Perceptron *)local_d8);
    index_00 = index_00 + 1;
  }
  Perceptron::~Perceptron(&local_80);
  return;
}

Assistant:

void ANN::print(uint index) const{
    Perceptron perceptron;
    for(uint i=0;i<m_layers[index].get_nb_perceptrons();++i){
        const Perceptron perceptron=m_layers[index].get_perceptron(i);
        std::cout<<m_layers[index].label(i)<<": "<<perceptron.get_output()<<'\n';
    }
}